

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

bool __thiscall QWidgetTextControlPrivate::isPreediting(QWidgetTextControlPrivate *this)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QArrayData *local_30;
  long local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::block();
  lVar2 = QTextBlock::layout();
  if (lVar2 == 0) {
    bVar3 = false;
  }
  else {
    QTextLayout::preeditAreaText();
    bVar3 = local_20 != 0;
    if (local_30 != (QArrayData *)0x0) {
      LOCK();
      (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_30,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QWidgetTextControlPrivate::isPreediting() const
{
    QTextLayout *layout = cursor.block().layout();
    if (layout && !layout->preeditAreaText().isEmpty())
        return true;

    return false;
}